

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

void socketpair_pinger_new(int vectored_writes)

{
  int iVar1;
  pinger_t *pinger;
  undefined8 uVar2;
  undefined8 *puVar3;
  anon_union_232_2_629321f6_for_stream *paVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_os_sock_t fds [2];
  undefined4 local_30;
  undefined4 local_2c;
  
  pinger = (pinger_t *)malloc(0x168);
  if (pinger == (pinger_t *)0x0) {
    socketpair_pinger_new_cold_11();
LAB_001af2f1:
    socketpair_pinger_new_cold_1();
LAB_001af300:
    socketpair_pinger_new_cold_2();
LAB_001af30f:
    socketpair_pinger_new_cold_3();
LAB_001af31e:
    socketpair_pinger_new_cold_4();
LAB_001af32d:
    socketpair_pinger_new_cold_5();
LAB_001af33c:
    socketpair_pinger_new_cold_10();
LAB_001af341:
    socketpair_pinger_new_cold_6();
LAB_001af350:
    socketpair_pinger_new_cold_7();
  }
  else {
    pinger->vectored_writes = vectored_writes;
    pinger->pongs = 0;
    pinger->state = 0;
    pinger->pong = PONG;
    uv_default_loop();
    iVar1 = uv_socketpair(1,0,&local_30,0x40,0x40);
    if (iVar1 != 0) goto LAB_001af2f1;
    iVar1 = uv_guess_handle(local_30);
    if (iVar1 != 7) goto LAB_001af300;
    iVar1 = uv_guess_handle(local_2c);
    if (iVar1 != 7) goto LAB_001af30f;
    uVar2 = uv_default_loop();
    paVar4 = &pinger->stream;
    iVar1 = uv_tcp_init(uVar2,paVar4);
    if (iVar1 != 0) goto LAB_001af31e;
    (pinger->stream).tcp.data = pinger;
    iVar1 = uv_tcp_open(paVar4,local_2c);
    if (iVar1 != 0) goto LAB_001af32d;
    puVar3 = (undefined8 *)malloc(0xd8);
    if (puVar3 == (undefined8 *)0x0) goto LAB_001af33c;
    *puVar3 = 0;
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,puVar3);
    if (iVar1 != 0) goto LAB_001af341;
    iVar1 = uv_tcp_open(puVar3,local_30);
    if (iVar1 != 0) goto LAB_001af350;
    pinger_write_ping(pinger);
    iVar1 = uv_read_start(paVar4,alloc_cb,pinger_read_cb);
    if (iVar1 == 0) {
      iVar1 = uv_read_start(puVar3,alloc_cb,ponger_read_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001af36e;
    }
  }
  socketpair_pinger_new_cold_8();
LAB_001af36e:
  socketpair_pinger_new_cold_9();
  tcp_pinger_new(1);
  run_ping_pong_test();
  completed_pingers = 0;
  socketpair_pinger_new(1);
  run_ping_pong_test();
  return;
}

Assistant:

static void socketpair_pinger_new(int vectored_writes) {
  pinger_t* pinger;
  uv_os_sock_t fds[2];
  uv_tcp_t* ponger;

  pinger = malloc(sizeof(*pinger));
  ASSERT_NOT_NULL(pinger);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;
  pinger->pong = PONG;

  /* Try to make a socketpair and do NUM_PINGS ping-pongs. */
  (void)uv_default_loop(); /* ensure WSAStartup has been performed */
  ASSERT_OK(uv_socketpair(SOCK_STREAM, 0, fds, UV_NONBLOCK_PIPE, UV_NONBLOCK_PIPE));
#ifndef _WIN32
  /* On Windows, this is actually a UV_TCP, but libuv doesn't detect that. */
  ASSERT_EQ(uv_guess_handle((uv_os_fd_t) fds[0]), UV_NAMED_PIPE);
  ASSERT_EQ(uv_guess_handle((uv_os_fd_t) fds[1]), UV_NAMED_PIPE);
#endif

  ASSERT_OK(uv_tcp_init(uv_default_loop(), &pinger->stream.tcp));
  pinger->stream.pipe.data = pinger;
  ASSERT_OK(uv_tcp_open(&pinger->stream.tcp, fds[1]));

  ponger = malloc(sizeof(*ponger));
  ASSERT_NOT_NULL(ponger);
  ponger->data = NULL;
  ASSERT_OK(uv_tcp_init(uv_default_loop(), ponger));
  ASSERT_OK(uv_tcp_open(ponger, fds[0]));

  pinger_write_ping(pinger);

  ASSERT_OK(uv_read_start((uv_stream_t*) &pinger->stream.tcp,
                          alloc_cb,
                          pinger_read_cb));
  ASSERT_OK(uv_read_start((uv_stream_t*) ponger,
                          alloc_cb,
                          ponger_read_cb));
}